

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::UnderscoresToCamelCase_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field)

{
  string local_38;
  java *local_18;
  FieldDescriptor *field_local;
  
  local_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  (anonymous_namespace)::FieldName_abi_cxx11_(&local_38,(_anonymous_namespace_ *)this,field);
  UnderscoresToCamelCase(__return_storage_ptr__,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string UnderscoresToCamelCase(const FieldDescriptor* field) {
  return UnderscoresToCamelCase(FieldName(field), false);
}